

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall CTcTokenizer::peek_ahead(CTcTokenizer *this,char *s1,char *s2)

{
  tc_toktyp_t tVar1;
  int iVar2;
  char *in_RDX;
  CTcTokenizer *in_RSI;
  CTcTokenizer *in_RDI;
  int match;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar3;
  
  tVar1 = cur((CTcTokenizer *)0x2e4892);
  if (tVar1 == TOKT_SYM) {
    strlen((char *)in_RSI);
    iVar2 = cur_tok_matches(in_RDI,(char *)in_RSI,
                            CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    if (iVar2 != 0) {
      tVar1 = next(in_RSI);
      uVar3 = false;
      if (tVar1 == TOKT_SYM) {
        strlen(in_RDX);
        iVar2 = cur_tok_matches(in_RDI,(char *)in_RSI,CONCAT17(uVar3,in_stack_ffffffffffffffc0));
        uVar3 = iVar2 != 0;
      }
      unget((CTcTokenizer *)0x2e4928);
      return (uint)(byte)uVar3;
    }
  }
  return 0;
}

Assistant:

int CTcTokenizer::peek_ahead(const char *s1, const char *s2)
{
    /* if the first token doesn't match, the sequence doesn't match */
    if (cur() != TOKT_SYM || !cur_tok_matches(s1, strlen(s1)))
        return FALSE;

    /* check the next token - if it matches, we have a sequence match */
    int match = (next() == TOKT_SYM && cur_tok_matches(s2, strlen(s2)));

    /* whatever happened, un-get the second token, since we're just peeking */
    unget();

    /* return the match indication */
    return match;
}